

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void event_logv_(int severity,char *errstr,char *fmt,__va_list_tag *ap)

{
  size_t sVar1;
  size_t len;
  char buf [1024];
  __va_list_tag *ap_local;
  char *fmt_local;
  char *errstr_local;
  int severity_local;
  
  if ((severity != 0) || (event_debug_logging_mask_ != 0)) {
    buf._1016_8_ = ap;
    if (fmt == (char *)0x0) {
      len._0_1_ = 0;
    }
    else {
      evutil_vsnprintf((char *)&len,0x400,fmt,ap);
    }
    if ((errstr != (char *)0x0) && (sVar1 = strlen((char *)&len), sVar1 < 0x3fd)) {
      evutil_snprintf(buf + (sVar1 - 8),0x400 - sVar1,": %s",errstr);
    }
    event_log(severity,(char *)&len);
  }
  return;
}

Assistant:

void
event_logv_(int severity, const char *errstr, const char *fmt, va_list ap)
{
	char buf[1024];
	size_t len;

	if (severity == EVENT_LOG_DEBUG && !event_debug_get_logging_mask_())
		return;

	if (fmt != NULL)
		evutil_vsnprintf(buf, sizeof(buf), fmt, ap);
	else
		buf[0] = '\0';

	if (errstr) {
		len = strlen(buf);
		if (len < sizeof(buf) - 3) {
			evutil_snprintf(buf + len, sizeof(buf) - len, ": %s", errstr);
		}
	}

	event_log(severity, buf);
}